

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint128.hpp
# Opt level: O1

uint128 * __thiscall trng::portable_impl::uint128::operator<<=(uint128 *this,int s)

{
  ulong uVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = this->m_lo;
  uVar1 = this->m_hi;
  bVar2 = (byte)s;
  if (s < 0) {
    if (s < -0x3f) {
      uVar4 = uVar1 >> (-bVar2 & 0x3f);
      uVar3 = 0;
    }
    else {
      uVar3 = uVar1 >> (-bVar2 & 0x3f);
      bVar2 = bVar2 + 0x40 & 0x3f;
      uVar4 = uVar1 << bVar2 | uVar4 >> 0x40 - bVar2;
    }
  }
  else {
    uVar3 = uVar1;
    if (s != 0) {
      if (s < 0x40) {
        uVar3 = uVar1 << (bVar2 & 0x3f) | uVar4 >> 0x40 - (bVar2 & 0x3f);
        uVar4 = uVar4 << (bVar2 & 0x3f);
      }
      else {
        uVar3 = uVar4 << (bVar2 & 0x3f);
        uVar4 = 0;
      }
    }
  }
  this->m_lo = uVar4;
  this->m_hi = uVar3;
  return this;
}

Assistant:

uint128 &operator<<=(int s) {
        const uint128 result(*this << s);
        *this = result;
        return *this;
      }